

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree_star_simplex_iterators.h
# Opt level: O3

bool __thiscall
Gudhi::
Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>
::is_coface::operator()(is_coface *this,Hooks_simplex_base *curr_hooks)

{
  stored_size_type sVar1;
  bool bVar2;
  size_type sz;
  invalid_argument *this_00;
  pointer bg;
  Simplex_vertex_range local_48;
  Simplex_handle local_28;
  long local_20;
  undefined1 *local_18;
  
  if (curr_hooks[1].list_max_vertex_hook_.super_type.super_type.next_[2].next_ == (node_ptr)0x0) {
    __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                  "static pointer boost::intrusive::bhtraits_base<boost::container::dtl::tree_node<std::pair<const short, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>>>, void *, boost::container::red_black_tree, true>, boost::intrusive::compact_rbtree_node<void *> *, boost::intrusive::dft_tag, 3>::to_value_ptr(const node_ptr &) [T = boost::container::dtl::tree_node<std::pair<const short, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>>>, void *, boost::container::red_black_tree, true>, NodePtr = boost::intrusive::compact_rbtree_node<void *> *, Tag = boost::intrusive::dft_tag, Type = 3]"
                 );
  }
  local_28.m_iit.members_.nodeptr_ =
       (tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
        )(curr_hooks + -4);
  Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>::simplex_vertex_range
            (&local_48,this->cpx_,&local_28);
  sVar1 = (this->simp_).
          super_vector<short,_boost::container::dtl::static_storage_allocator<short,_40UL,_0UL,_true>,_void>
          .m_holder.m_size;
  if (sVar1 != 0) {
    if (local_48.
        super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_boost::iterators::incrementable_traversal_tag>
        .m_Begin.v_ ==
        *(short *)&(this->simp_).
                   super_vector<short,_boost::container::dtl::static_storage_allocator<short,_40UL,_0UL,_true>,_void>
                   .m_holder.super_static_storage_allocator<short,_40UL,_0UL,_true>.storage) {
      local_18 = (undefined1 *)
                 ((long)&(this->simp_).
                         super_vector<short,_boost::container::dtl::static_storage_allocator<short,_40UL,_0UL,_true>,_void>
                         .m_holder.super_static_storage_allocator<short,_40UL,_0UL,_true>.storage +
                 2);
      local_20 = (long)&(this->simp_).
                        super_vector<short,_boost::container::dtl::static_storage_allocator<short,_40UL,_0UL,_true>,_void>
                        .m_holder.super_static_storage_allocator<short,_40UL,_0UL,_true>.storage +
                 sVar1 * 2;
      bVar2 = std::
              __includes<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>>,boost::container::vec_iterator<short*,false>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<short>>>
                        ((local_48.
                          super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_boost::iterators::incrementable_traversal_tag>
                          .m_Begin.sib_)->oncles_,
                         *(undefined4 *)
                          &(local_48.
                            super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_boost::iterators::incrementable_traversal_tag>
                            .m_Begin.sib_)->parent_,
                         local_48.
                         super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_boost::iterators::incrementable_traversal_tag>
                         .m_End.sib_,
                         local_48.
                         super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_boost::iterators::incrementable_traversal_tag>
                         .m_End._8_4_);
      return bVar2;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"first Node must always have label simp_.begin()");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  __assert_fail("!this->empty()","/usr/include/boost/container/vector.hpp",0x60c,
                "reference boost::container::vector<short, boost::container::dtl::static_storage_allocator<short, 40, 0, true>>::front() [T = short, A = boost::container::dtl::static_storage_allocator<short, 40, 0, true>, Options = void]"
               );
}

Assistant:

is_coface(SimplexTree const* cpx, Static_vertex_vector&& simp) : cpx_(cpx), simp_(simp) {}